

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  uint uVar2;
  SPIREntryPoint *pSVar3;
  runtime_error *prVar4;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  char *pcVar8;
  string local_48;
  BuiltIn local_24;
  
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_0000000c,storage);
  pbVar6 = pbVar5;
  local_24 = builtin;
  if (0x1395 < (int)builtin) {
    if ((int)builtin < 0x14c7) {
      if (builtin == BuiltInFragStencilRefEXT) {
        if ((this->options).es != false) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Stencil export not supported in GLES.","");
          ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_stencil_export","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_FragStencilRefARB";
        pcVar7 = "";
      }
      else if (builtin == BuiltInBaryCoordNV) {
        bVar1 = (this->options).es;
        uVar2 = (this->options).version;
        if ((uVar2 < 0x140 & bVar1) == 1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"gl_BaryCoordNV requires ESSL 320.","");
          ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (bVar1 == false && uVar2 < 0x1c2) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"gl_BaryCoordNV requires GLSL 450.","");
          ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_NV_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_BaryCoordNV";
        pcVar7 = "";
      }
      else {
        if (builtin != BuiltInBaryCoordNoPerspNV) goto switchD_001d09cd_caseD_2;
        bVar1 = (this->options).es;
        uVar2 = (this->options).version;
        if ((uVar2 < 0x140 & bVar1) == 1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"gl_BaryCoordNoPerspNV requires ESSL 320.","");
          ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (bVar1 == false && uVar2 < 0x1c2) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"gl_BaryCoordNoPerspNV requires GLSL 450.","");
          ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
          *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_NV_fragment_shader_barycentric","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_BaryCoordNoPerspNV";
        pcVar7 = "";
      }
      goto LAB_001d1829;
    }
    if (0x20 < builtin - BuiltInLaunchIdKHR) goto switchD_001d09cd_caseD_2;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&switchD_001d0a0e::switchdataD_002dc8fc +
             (long)(int)(&switchD_001d0a0e::switchdataD_002dc8fc)[builtin - BuiltInLaunchIdKHR]);
    switch(builtin) {
    case BuiltInLaunchIdKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_LaunchIDNV";
      pcVar7 = "";
      break;
    case BuiltInLaunchSizeKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_LaunchSizeNV";
      pcVar7 = "";
      break;
    case BuiltInWorldRayOriginKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_WorldRayOriginNV";
      pcVar7 = "";
      break;
    case BuiltInWorldRayDirectionKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_WorldRayDirectionNV";
      pcVar7 = "";
      break;
    case BuiltInObjectRayOriginKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_ObjectRayOriginNV";
      pcVar7 = "";
      break;
    case BuiltInObjectRayDirectionKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_ObjectRayDirectionNV";
      pcVar7 = "";
      break;
    case BuiltInRayTminKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_RayTminNV";
      pcVar7 = "";
      break;
    case BuiltInRayTmaxKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_RayTmaxNV";
      pcVar7 = "";
      break;
    case BuiltInInstanceCustomIndexKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_InstanceCustomIndexNV";
      pcVar7 = "";
      break;
    default:
      goto switchD_001d09cd_caseD_2;
    case BuiltInObjectToWorldKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_ObjectToWorldNV";
      pcVar7 = "";
      break;
    case BuiltInWorldToObjectKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_WorldToObjectNV";
      pcVar7 = "";
      break;
    case BuiltInHitTKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_HitTNV";
      pcVar7 = "";
      break;
    case BuiltInHitKindKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_HitKindNV";
      pcVar7 = "";
      break;
    case BuiltInIncomingRayFlagsKHR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_IncomingRayFlagsNV";
      pcVar7 = "";
    }
    goto LAB_001d1829;
  }
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &switchD_001d09cd::switchdataD_002dc7e8;
  switch(builtin) {
  case BuiltInPosition:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_Position";
    pcVar7 = "";
    break;
  case BuiltInPointSize:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_PointSize";
    pcVar7 = "";
    break;
  case 2:
  case BuiltInPatchVertices:
  case BuiltInSampleMask|BuiltInPointSize:
  case BuiltInWorkDim:
  case BuiltInGlobalSize:
  case BuiltInEnqueuedWorkgroupSize:
  case BuiltInGlobalOffset:
  case BuiltInGlobalLinearId:
  case BuiltInGlobalLinearId|BuiltInPointSize:
  case BuiltInSubgroupMaxSize:
  case BuiltInNumEnqueuedSubgroups:
switchD_001d09cd_caseD_2:
    convert_to_string<spv::BuiltIn,_0>(&local_48,&local_24);
    join<char_const(&)[12],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)"gl_BuiltIn_",(char (*) [12])&local_48,pbVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_48._M_dataplus._M_p);
    return __return_storage_ptr__;
  case BuiltInClipDistance:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_ClipDistance";
    pcVar7 = "";
    break;
  case BuiltInCullDistance:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_CullDistance";
    pcVar7 = "";
    break;
  case BuiltInVertexId:
    if ((this->options).vulkan_semantics == true) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                 ,"");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
      *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_001d111f;
  case BuiltInInstanceId:
    if (((this->options).vulkan_semantics == true) &&
       (pSVar3 = Compiler::get_entry_point(&this->super_Compiler),
       2 < pSVar3->model - ExecutionModelIntersectionKHR)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                 ,"");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
      *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_ARB_draw_instanced","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    goto LAB_001d1674;
  case BuiltInPrimitiveId:
    if ((storage == StorageClassInput) &&
       (pSVar3 = Compiler::get_entry_point(&this->super_Compiler),
       pSVar3->model == ExecutionModelGeometry)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PrimitiveIDIn";
      pcVar7 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_PrimitiveID";
      pcVar7 = "";
    }
    break;
  case BuiltInInvocationId:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_InvocationID";
    pcVar7 = "";
    break;
  case BuiltInLayer:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_Layer";
    pcVar7 = "";
    break;
  case BuiltInViewportIndex:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_ViewportIndex";
    pcVar7 = "";
    break;
  case BuiltInTessLevelOuter:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_TessLevelOuter";
    pcVar7 = "";
    break;
  case BuiltInTessLevelInner:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_TessLevelInner";
    pcVar7 = "";
    break;
  case BuiltInTessCoord:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_TessCoord";
    pcVar7 = "";
    break;
  case BuiltInFragCoord:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_FragCoord";
    pcVar7 = "";
    break;
  case BuiltInPointCoord:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_PointCoord";
    pcVar7 = "";
    break;
  case BuiltInFrontFacing:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_FrontFacing";
    pcVar7 = "";
    break;
  case BuiltInSampleId:
    if (((this->options).es == true) && ((this->options).version < 0x140)) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_OES_sample_variables","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    if (((this->options).es == false) && ((this->options).version < 400)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"gl_SampleID not supported before GLSL 400.","");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
      *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_SampleID";
    pcVar7 = "";
    break;
  case BuiltInSamplePosition:
    if (((this->options).es == true) && ((this->options).version < 0x140)) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_OES_sample_variables","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    if (((this->options).es == false) && ((this->options).version < 400)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"gl_SamplePosition not supported before GLSL 400.","");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
      *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_SamplePosition";
    pcVar7 = "";
    break;
  case BuiltInSampleMask:
    if (((this->options).es == true) && ((this->options).version < 0x140)) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_OES_sample_variables","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    if (((this->options).es == false) && ((this->options).version < 400)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.",
                 "");
      ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
      *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (storage == StorageClassInput) {
      pcVar8 = "gl_SampleMaskIn";
      pcVar7 = "";
    }
    else {
      pcVar8 = "gl_SampleMask";
      pcVar7 = "";
    }
    break;
  case BuiltInFragDepth:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_FragDepth";
    pcVar7 = "";
    break;
  case BuiltInHelperInvocation:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_HelperInvocation";
    pcVar7 = "";
    break;
  case BuiltInNumWorkgroups:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_NumWorkGroups";
    pcVar7 = "";
    break;
  case BuiltInWorkgroupSize:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_WorkGroupSize";
    pcVar7 = "";
    break;
  case BuiltInWorkgroupId:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_WorkGroupID";
    pcVar7 = "";
    break;
  case BuiltInLocalInvocationId:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_LocalInvocationID";
    pcVar7 = "";
    break;
  case BuiltInGlobalInvocationId:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_GlobalInvocationID";
    pcVar7 = "";
    break;
  case BuiltInLocalInvocationIndex:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_LocalInvocationIndex";
    pcVar7 = "";
    break;
  case BuiltInSubgroupSize:
    request_subgroup_feature(this,SubgroupSize);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_SubgroupSize";
    pcVar7 = "";
    break;
  case BuiltInNumSubgroups:
    request_subgroup_feature(this,NumSubgroups);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_NumSubgroups";
    pcVar7 = "";
    break;
  case BuiltInSubgroupId:
    request_subgroup_feature(this,SubgroupID);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_SubgroupID";
    pcVar7 = "";
    break;
  case BuiltInSubgroupLocalInvocationId:
    request_subgroup_feature(this,SubgroupInvocationID);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_SubgroupInvocationID";
    pcVar7 = "";
    break;
  case BuiltInVertexIndex:
    bVar1 = (this->options).vulkan_semantics;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar1 == true) {
      pcVar8 = "gl_VertexIndex";
      pcVar7 = "";
      break;
    }
LAB_001d111f:
    pcVar8 = "gl_VertexID";
    pcVar7 = "";
    break;
  case BuiltInInstanceIndex:
    if ((this->options).vulkan_semantics == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_InstanceIndex";
      pcVar7 = "";
      break;
    }
    if (((this->options).es == false) && ((this->options).version < 0x8c)) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_ARB_draw_instanced","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    if ((this->options).vertex.support_nonzero_base_instance == true) {
      if ((this->options).vulkan_semantics == false) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "(gl_InstanceID + SPIRV_Cross_BaseInstance)";
      pcVar7 = "";
      break;
    }
LAB_001d1674:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "gl_InstanceID";
    pcVar7 = "";
    break;
  default:
    pbVar6 = pbVar5;
    if (0x18 < builtin - BuiltInSubgroupEqMask) goto switchD_001d09cd_caseD_2;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&switchD_001d0a47::switchdataD_002dc898 +
             (long)(int)(&switchD_001d0a47::switchdataD_002dc898)[builtin - BuiltInSubgroupEqMask]);
    switch(builtin) {
    case BuiltInSubgroupEqMask:
      request_subgroup_feature(this,SubgroupMask);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupEqMask";
      pcVar7 = "";
      break;
    case BuiltInSubgroupGeMask:
      request_subgroup_feature(this,SubgroupMask);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupGeMask";
      pcVar7 = "";
      break;
    case BuiltInSubgroupGtMask:
      request_subgroup_feature(this,SubgroupMask);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupGtMask";
      pcVar7 = "";
      break;
    case BuiltInSubgroupLeMask:
      request_subgroup_feature(this,SubgroupMask);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupLeMask";
      pcVar7 = "";
      break;
    case BuiltInSubgroupLtMask:
      request_subgroup_feature(this,SubgroupMask);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_SubgroupLtMask";
      pcVar7 = "";
      break;
    default:
      goto switchD_001d09cd_caseD_2;
    case BuiltInBaseVertex:
      if ((this->options).es == true) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"BaseVertex not supported in ES profile.","");
        ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
        *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).vulkan_semantics == true) {
        if ((this->options).version < 0x1cc) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "gl_BaseVertexARB";
          pcVar7 = "";
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "gl_BaseVertex";
          pcVar7 = "";
        }
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "SPIRV_Cross_BaseVertex";
        pcVar7 = "";
      }
      break;
    case BuiltInBaseInstance:
      if ((this->options).es == true) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"BaseInstance not supported in ES profile.","");
        ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
        *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).vulkan_semantics == true) {
        if ((this->options).version < 0x1cc) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
          require_extension_internal(this,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "gl_BaseInstanceARB";
          pcVar7 = "";
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "gl_BaseInstance";
          pcVar7 = "";
        }
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "SPIRV_Cross_BaseInstance";
        pcVar7 = "";
      }
      break;
    case BuiltInDrawIndex:
      if ((this->options).es == true) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"DrawIndex not supported in ES profile.","");
        ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
        *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).vulkan_semantics == true) {
        if (0x1cb < (this->options).version) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar8 = "gl_DrawID";
          pcVar7 = "";
          break;
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
        require_extension_internal(this,&local_48);
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_ARB_shader_draw_parameters","");
        require_extension_internal(this,&local_48);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_DrawIDARB";
      pcVar7 = "";
      break;
    case BuiltInDeviceIndex:
      if ((this->options).vulkan_semantics == false) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Need Vulkan semantics for device group support.","");
        ::std::runtime_error::runtime_error(prVar4,(string *)&local_48);
        *(undefined ***)prVar4 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_EXT_device_group","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "gl_DeviceIndex";
      pcVar7 = "";
      break;
    case BuiltInViewIndex:
      if ((this->options).vulkan_semantics == true) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_EXT_multiview","")
        ;
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_ViewIndex";
        pcVar7 = "";
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"GL_OVR_multiview2","");
        require_extension_internal(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "gl_ViewID_OVR";
        pcVar7 = "";
      }
    }
  }
LAB_001d1829:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
		return "gl_ClipDistance";
	case BuiltInCullDistance:
		return "gl_CullDistance";
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "SPIRV_Cross_BaseVertex";
		}
		break;

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "SPIRV_Cross_BaseInstance";
		}
		break;

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "gl_DrawIDARB";
		}
		break;

	case BuiltInSampleId:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleID not supported before GLSL 400.");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SamplePosition not supported before GLSL 400.");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
		{
			require_extension_internal("GL_EXT_multiview");
			return "gl_ViewIndex";
		}
		else
		{
			require_extension_internal("GL_OVR_multiview2");
			return "gl_ViewID_OVR";
		}

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdNV:
		return "gl_LaunchIDNV";
	case BuiltInLaunchSizeNV:
		return "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginNV:
		return "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionNV:
		return "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginNV:
		return "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionNV:
		return "gl_ObjectRayDirectionNV";
	case BuiltInRayTminNV:
		return "gl_RayTminNV";
	case BuiltInRayTmaxNV:
		return "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexNV:
		return "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldNV:
		return "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectNV:
		return "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		return "gl_HitTNV";
	case BuiltInHitKindNV:
		return "gl_HitKindNV";
	case BuiltInIncomingRayFlagsNV:
		return "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNV requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNV requires GLSL 450.");
		require_extension_internal("GL_NV_fragment_shader_barycentric");
		return "gl_BaryCoordNV";
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspNV requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspNV requires GLSL 450.");
		require_extension_internal("GL_NV_fragment_shader_barycentric");
		return "gl_BaryCoordNoPerspNV";
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}